

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCols(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,bool scale)

{
  undefined8 *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pnVar6;
  Item *pIVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  long lVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  long lVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  long lVar21;
  int iVar22;
  Item *pIVar23;
  long lVar24;
  cpp_dec_float<100U,_int,_void> *pcVar25;
  ulong uVar26;
  int iVar27;
  long in_FS_OFFSET;
  DataArray<int> local_2d0;
  DataArray<int> *local_2b8;
  DataKey local_2b0;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2a8;
  undefined4 local_198;
  uint uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  double local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  undefined1 local_134;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  iVar3 = (this->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  lVar17 = (long)iVar3;
  iVar4 = (this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_2d0.data = (int *)0x0;
  local_2d0.memFactor = 1.2;
  local_2d0.thesize = 0;
  if (0 < iVar4) {
    local_2d0.thesize = iVar4;
  }
  local_2d0.themax = 1;
  if (0 < iVar4) {
    local_2d0.themax = local_2d0.thesize;
  }
  spx_alloc<int*>(&local_2d0.data,local_2d0.themax);
  if (&this->
       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      != set) {
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(&this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ,set);
  }
  lVar19 = (long)(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < lVar19) {
    memset(local_2d0.data,0,lVar19 << 2);
  }
  lVar19 = (long)(set->
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).set.thenum;
  if (0 < lVar19) {
    do {
      pIVar23 = (set->
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).set.theitem;
      iVar27 = (set->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thekey[lVar19 + -1].idx;
      lVar24 = (long)pIVar23[iVar27].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar24) {
        do {
          iVar5 = pIVar23[iVar27].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .m_elem[lVar24 + -1].idx;
          if ((this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= iVar5) {
            LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::LPRowBase(&local_2a8,0);
            DataArray<int>::reSize(&local_2d0,iVar5 + 1);
            iVar22 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
            lVar21 = (long)iVar22;
            if (iVar22 <= iVar5) {
              iVar22 = (iVar5 - iVar22) + 1;
              do {
                local_2d0.data[lVar21] = 0;
                local_2b0.info = 0;
                local_2b0.idx = -1;
                LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::add(&this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,&local_2b0,&local_2a8);
                lVar21 = lVar21 + 1;
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
            }
            local_2a8.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a3d50;
            if (local_2a8.vec.theelem !=
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
              free(local_2a8.vec.theelem);
            }
          }
          local_2d0.data[iVar5] = local_2d0.data[iVar5] + 1;
          bVar9 = 1 < lVar24;
          lVar24 = lVar24 + -1;
        } while (bVar9);
      }
      bVar9 = 1 < lVar19;
      lVar19 = lVar19 + -1;
    } while (bVar9);
  }
  iVar27 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (0 < iVar27) {
    lVar19 = 0;
    do {
      if (0 < local_2d0.data[lVar19]) {
        pIVar23 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar19].idx;
        iVar27 = local_2d0.data[lVar19] +
                 (pIVar23->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)this,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)pIVar23,iVar27);
        (this->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.theitem
        [(this->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thekey[lVar19].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = iVar27;
        iVar27 = (this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < iVar27);
  }
  iVar27 = (this->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (iVar3 < iVar27) {
    local_2b8 = &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp;
    local_188 = *(double *)(in_FS_OFFSET + -8);
    local_198 = SUB84(local_188,0);
    uStack_180 = 0;
    uStack_194 = (uint)((ulong)local_188 >> 0x20) ^ 0x80000000;
    uStack_190 = 0;
    uStack_18c = 0x80000000;
    do {
      if (this->thesense == MAXIMIZE) {
        local_2a8.left.m_backend.data._M_elems[0] = 1;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar17),(int *)&local_2a8);
      }
      else {
        local_2a8.left.m_backend.data._M_elems[0] = 0xffffffff;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
        ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                      *)((this->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar17),(int *)&local_2a8);
      }
      pIVar23 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar17].idx;
      uVar16 = 0;
      if (scale) {
        uVar16 = (*this->lp_scaler->_vptr_SPxScaler[1])(this->lp_scaler,pIVar23,local_2b8);
        pcVar25 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17].m_backend;
        ::soplex::infinity::__tls_init();
        local_2a8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_2a8.left.m_backend.prec_elem = 0x10;
        local_2a8.left.m_backend.data._M_elems[0] = 0;
        local_2a8.left.m_backend.data._M_elems[1] = 0;
        local_2a8.left.m_backend.data._M_elems[2] = 0;
        local_2a8.left.m_backend.data._M_elems[3] = 0;
        local_2a8.left.m_backend.data._M_elems[4] = 0;
        local_2a8.left.m_backend.data._M_elems[5] = 0;
        local_2a8.left.m_backend.data._M_elems[6] = 0;
        local_2a8.left.m_backend.data._M_elems[7] = 0;
        local_2a8.left.m_backend.data._M_elems[8] = 0;
        local_2a8.left.m_backend.data._M_elems[9] = 0;
        local_2a8.left.m_backend.data._M_elems[10] = 0;
        local_2a8.left.m_backend.data._M_elems[0xb] = 0;
        local_2a8.left.m_backend.data._M_elems[0xc] = 0;
        local_2a8.left.m_backend.data._M_elems[0xd] = 0;
        local_2a8.left.m_backend.data._M_elems._56_5_ = 0;
        local_2a8.left.m_backend.data._M_elems[0xf]._1_3_ = 0;
        local_2a8.left.m_backend.exp = 0;
        local_2a8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_2a8,local_188);
        if (((pcVar25->fpclass != cpp_dec_float_NaN) &&
            (local_2a8.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (pcVar25,(cpp_dec_float<100U,_int,_void> *)&local_2a8), iVar27 < 0))
        {
          pnVar6 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_88 = *(undefined8 *)&pnVar6[lVar17].m_backend.data;
          uStack_80 = *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
          local_78 = *(undefined8 *)puVar2;
          uStack_70 = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
          local_68 = *(undefined8 *)puVar2;
          uStack_60 = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
          local_58 = *(undefined8 *)puVar2;
          uStack_50 = *(undefined8 *)(puVar2 + 2);
          local_48 = pnVar6[lVar17].m_backend.exp;
          local_44 = pnVar6[lVar17].m_backend.neg;
          local_40._0_4_ = pnVar6[lVar17].m_backend.fpclass;
          local_40._4_4_ = pnVar6[lVar17].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_2a8,(soplex *)&local_88,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)-uVar16,CONCAT31((int3)((uint)local_48 >> 8),local_44));
          pnVar6 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._48_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_2a8.left.m_backend.data._M_elems[0xf]._1_3_,
                        local_2a8.left.m_backend.data._M_elems._56_5_);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._32_8_;
          *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._40_8_;
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._24_8_;
          *(undefined8 *)&pnVar6[lVar17].m_backend.data =
               local_2a8.left.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2) =
               local_2a8.left.m_backend.data._M_elems._8_8_;
          pnVar6[lVar17].m_backend.exp = local_2a8.left.m_backend.exp;
          pnVar6[lVar17].m_backend.neg = local_2a8.left.m_backend.neg;
          pnVar6[lVar17].m_backend.fpclass = local_2a8.left.m_backend.fpclass;
          pnVar6[lVar17].m_backend.prec_elem = local_2a8.left.m_backend.prec_elem;
        }
        pcVar25 = &(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar17].m_backend;
        ::soplex::infinity::__tls_init();
        local_2a8.left.m_backend.fpclass = cpp_dec_float_finite;
        local_2a8.left.m_backend.prec_elem = 0x10;
        local_2a8.left.m_backend.data._M_elems[0] = 0;
        local_2a8.left.m_backend.data._M_elems[1] = 0;
        local_2a8.left.m_backend.data._M_elems[2] = 0;
        local_2a8.left.m_backend.data._M_elems[3] = 0;
        local_2a8.left.m_backend.data._M_elems[4] = 0;
        local_2a8.left.m_backend.data._M_elems[5] = 0;
        local_2a8.left.m_backend.data._M_elems[6] = 0;
        local_2a8.left.m_backend.data._M_elems[7] = 0;
        local_2a8.left.m_backend.data._M_elems[8] = 0;
        local_2a8.left.m_backend.data._M_elems[9] = 0;
        local_2a8.left.m_backend.data._M_elems[10] = 0;
        local_2a8.left.m_backend.data._M_elems[0xb] = 0;
        local_2a8.left.m_backend.data._M_elems[0xc] = 0;
        local_2a8.left.m_backend.data._M_elems[0xd] = 0;
        local_2a8.left.m_backend.data._M_elems._56_5_ = 0;
        local_2a8.left.m_backend.data._M_elems[0xf]._1_3_ = 0;
        local_2a8.left.m_backend.exp = 0;
        local_2a8.left.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_2a8,(double)CONCAT44(uStack_194,local_198)
                  );
        if (((pcVar25->fpclass != cpp_dec_float_NaN) &&
            (local_2a8.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar27 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (pcVar25,(cpp_dec_float<100U,_int,_void> *)&local_2a8), 0 < iVar27))
        {
          pnVar6 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d8 = *(undefined8 *)&pnVar6[lVar17].m_backend.data;
          uStack_d0 = *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
          local_c8 = *(undefined8 *)puVar2;
          uStack_c0 = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
          local_b8 = *(undefined8 *)puVar2;
          uStack_b0 = *(undefined8 *)(puVar2 + 2);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
          local_a8 = *(undefined8 *)puVar2;
          uStack_a0 = *(undefined8 *)(puVar2 + 2);
          local_98 = pnVar6[lVar17].m_backend.exp;
          local_94 = pnVar6[lVar17].m_backend.neg;
          local_90._0_4_ = pnVar6[lVar17].m_backend.fpclass;
          local_90._4_4_ = pnVar6[lVar17].m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_2a8,(soplex *)&local_d8,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)-uVar16,CONCAT31((int3)((uint)local_98 >> 8),local_94));
          pnVar6 = (this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._48_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(local_2a8.left.m_backend.data._M_elems[0xf]._1_3_,
                        local_2a8.left.m_backend.data._M_elems._56_5_);
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._32_8_;
          *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._40_8_;
          puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._24_8_;
          *(undefined8 *)&pnVar6[lVar17].m_backend.data =
               local_2a8.left.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2) =
               local_2a8.left.m_backend.data._M_elems._8_8_;
          pnVar6[lVar17].m_backend.exp = local_2a8.left.m_backend.exp;
          pnVar6[lVar17].m_backend.neg = local_2a8.left.m_backend.neg;
          pnVar6[lVar17].m_backend.fpclass = local_2a8.left.m_backend.fpclass;
          pnVar6[lVar17].m_backend.prec_elem = local_2a8.left.m_backend.prec_elem;
        }
        pnVar6 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_128 = *(undefined8 *)&pnVar6[lVar17].m_backend.data;
        uStack_120 = *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2);
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
        local_118 = *(undefined8 *)puVar2;
        uStack_110 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
        local_108 = *(undefined8 *)puVar2;
        uStack_100 = *(undefined8 *)(puVar2 + 2);
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
        local_f8 = *(undefined8 *)puVar2;
        uStack_f0 = *(undefined8 *)(puVar2 + 2);
        local_e8 = pnVar6[lVar17].m_backend.exp;
        local_e4 = pnVar6[lVar17].m_backend.neg;
        local_e0._0_4_ = pnVar6[lVar17].m_backend.fpclass;
        local_e0._4_4_ = pnVar6[lVar17].m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_2a8,(soplex *)&local_128,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)uVar16,CONCAT31((int3)((uint)local_e8 >> 8),local_e4));
        pnVar6 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._48_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_2a8.left.m_backend.data._M_elems[0xf]._1_3_,
                      local_2a8.left.m_backend.data._M_elems._56_5_);
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._32_8_;
        *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._40_8_;
        puVar2 = pnVar6[lVar17].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._16_8_;
        *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._24_8_;
        *(undefined8 *)&pnVar6[lVar17].m_backend.data = local_2a8.left.m_backend.data._M_elems._0_8_
        ;
        *(undefined8 *)(pnVar6[lVar17].m_backend.data._M_elems + 2) =
             local_2a8.left.m_backend.data._M_elems._8_8_;
        pnVar6[lVar17].m_backend.exp = local_2a8.left.m_backend.exp;
        pnVar6[lVar17].m_backend.neg = local_2a8.left.m_backend.neg;
        pnVar6[lVar17].m_backend.fpclass = local_2a8.left.m_backend.fpclass;
        pnVar6[lVar17].m_backend.prec_elem = local_2a8.left.m_backend.prec_elem;
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).scaleExp.data[lVar17] = uVar16;
      }
      lVar19 = (long)(pIVar23->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
      if (0 < lVar19) {
        uVar26 = lVar19 + 1;
        lVar19 = lVar19 * 0x54 + -0xc;
        do {
          pNVar18 = (pIVar23->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          iVar27 = *(int *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + 8);
          pIVar7 = (this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem;
          iVar5 = (this->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[iVar27].idx;
          lVar24 = (long)pIVar7[iVar5].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused - (long)local_2d0.data[iVar27];
          local_2d0.data[iVar27] = local_2d0.data[iVar27] + -1;
          pNVar20 = pIVar7[iVar5].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          pNVar20[lVar24].idx = (int)lVar17;
          if (scale) {
            puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x48);
            local_178 = *puVar1;
            uStack_170 = puVar1[1];
            puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x38);
            local_168 = *puVar1;
            uStack_160 = puVar1[1];
            puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x28);
            local_158 = *puVar1;
            uStack_150 = puVar1[1];
            puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x18);
            local_148 = *puVar1;
            uStack_140 = puVar1[1];
            local_138 = *(undefined4 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -8);
            local_134 = *(undefined1 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -4);
            local_130 = *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19);
            spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_2a8,(soplex *)&local_178,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)(ulong)((this->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).scaleExp.data[iVar27] + uVar16),iVar27);
            pNVar18 = (pIVar23->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            puVar2 = (uint *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x18);
            *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._48_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(local_2a8.left.m_backend.data._M_elems[0xf]._1_3_,
                          local_2a8.left.m_backend.data._M_elems._56_5_);
            puVar2 = (uint *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x28);
            *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._40_8_;
            puVar2 = (uint *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x38);
            *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._24_8_;
            puVar2 = (uint *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x48);
            *(undefined8 *)puVar2 = local_2a8.left.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_2a8.left.m_backend.data._M_elems._8_8_;
            *(int *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -8) =
                 local_2a8.left.m_backend.exp;
            *(bool *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -4) =
                 local_2a8.left.m_backend.neg;
            *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19) =
                 local_2a8.left.m_backend._72_8_;
            pNVar18 = (pIVar23->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            pNVar20 = pIVar7[iVar5].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
          }
          puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x48);
          uVar8 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x38);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x28);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          puVar1 = (undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -0x18);
          uVar15 = puVar1[1];
          puVar2 = pNVar20[lVar24].val.m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = *puVar1;
          *(undefined8 *)(puVar2 + 2) = uVar15;
          puVar2 = pNVar20[lVar24].val.m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = uVar13;
          *(undefined8 *)(puVar2 + 2) = uVar14;
          puVar2 = pNVar20[lVar24].val.m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = uVar11;
          *(undefined8 *)(puVar2 + 2) = uVar12;
          *(undefined8 *)&pNVar20[lVar24].val.m_backend.data = uVar8;
          *(undefined8 *)(pNVar20[lVar24].val.m_backend.data._M_elems + 2) = uVar10;
          pNVar20[lVar24].val.m_backend.exp =
               *(int *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -8);
          pNVar20[lVar24].val.m_backend.neg =
               *(bool *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19 + -4);
          uVar8 = *(undefined8 *)((long)(pNVar18->val).m_backend.data._M_elems + lVar19);
          pNVar20[lVar24].val.m_backend.fpclass = (int)uVar8;
          pNVar20[lVar24].val.m_backend.prec_elem = (int)((ulong)uVar8 >> 0x20);
          uVar26 = uVar26 - 1;
          lVar19 = lVar19 + -0x54;
        } while (1 < uVar26);
      }
      lVar17 = lVar17 + 1;
      iVar27 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
    } while (lVar17 < iVar27);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,(ulong)(uint)(iVar27 - iVar3));
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - iVar4));
  if (local_2d0.data != (int *)0x0) {
    free(local_2d0.data);
  }
  return;
}

Assistant:

void doAddCols(const LPColSetBase<R>& set, bool scale = false)
   {
      int i, j;
      int oldColNumber = nCols();
      int oldRowNumber = nRows();
      DataArray < int > newRows(nRows());

      if(&set != this)
         LPColSetBase<R>::add(set);

      assert(LPColSetBase<R>::isConsistent());
      assert(LPRowSetBase<R>::isConsistent());

      // count additional nonzeros per row
      for(i = nRows() - 1; i >= 0; --i)
         newRows[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.colVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new rows if required
            int l = vec.index(j);

            if(l >= nRows())
            {
               LPRowBase<R> empty;
               newRows.reSize(l + 1);

               for(int k = nRows(); k <= l; ++k)
               {
                  newRows[k] = 0;
                  LPRowSetBase<R>::add(empty);
               }

            }

            assert(l < nRows());
            newRows[l]++;
         }
      }

      // extend rows as required
      for(i = 0; i < nRows(); ++i)
      {
         if(newRows[i] > 0)
         {
            int len = newRows[i] + rowVector(i).size();
            LPRowSetBase<R>::xtend(i, len);
            rowVector_w(i).set_size(len);
         }
      }

      // insert new elements to row file
      for(i = oldColNumber; i < nCols(); ++i)
      {
         // @todo: Is there a better way to write the following if, else?
         if(thesense == MAXIMIZE)
         {
            LPColSetBase<R>::maxObj_w(i) *= 1;
         }
         else                  // thesense is MINIMIZE = -1
         {
            LPColSetBase<R>::maxObj_w(i) *= -1;
         }

         SVectorBase<R>& vec = colVector_w(i);
         int newColScaleExp = 0;

         DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

         // compute new column scaling factor and apply it to the bounds
         if(scale)
         {
            newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

            if(upper(i) < R(infinity))
               upper_w(i) = spxLdexp(upper_w(i), - newColScaleExp);

            if(lower(i) > R(-infinity))
               lower_w(i) = spxLdexp(lower_w(i), - newColScaleExp);

            maxObj_w(i) = spxLdexp(maxObj_w(i), newColScaleExp);

            LPColSetBase<R>::scaleExp[i] = newColScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            SVectorBase<R>& row = rowVector_w(k);
            int idx = row.size() - newRows[k];
            assert(newRows[k] > 0);
            newRows[k]--;
            row.index(idx) = i;

            // apply new column and existing row scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[k]);

            row.value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nRows(); ++i)
         assert(newRows[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nCols() - oldColNumber);
      addedCols(nCols() - oldColNumber);
      addedRows(nRows() - oldRowNumber);
   }